

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O2

Expression __thiscall
dynet::GRUBuilder::set_h_impl
          (GRUBuilder *this,int prev,
          vector<dynet::Expression,_std::allocator<dynet::Expression>_> *h_new)

{
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer pvVar5;
  pointer pvVar6;
  undefined8 uVar7;
  ostream *poVar8;
  invalid_argument *this_01;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  size_type __n;
  string local_1c0 [32];
  ostringstream oss;
  
  pEVar3 = (h_new->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (h_new->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar3 == pEVar4) {
    __n = (size_type)this->layers;
  }
  else {
    __n = (size_type)this->layers;
    if ((long)pEVar4 - (long)pEVar3 >> 4 != __n) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar8 = std::operator<<((ostream *)&oss,"Number of inputs passed to RNNBuilder::set_h() (");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8,") is not equal to the number of layers (");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::operator<<(poVar8,")");
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(this_01,local_1c0);
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  pvVar5 = (this->h).
           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = (this->h).
           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&oss,__n,
             (allocator_type *)local_1c0);
  this_00 = &this->h;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)this_00,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&oss);
  std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
            ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)&oss);
  uVar9 = ((long)pvVar5 - (long)pvVar6) / 0x18 & 0xffffffff;
  lVar10 = 0;
  for (uVar11 = 0; uVar11 < this->layers; uVar11 = uVar11 + 1) {
    puVar1 = (undefined8 *)
             ((long)&((h_new->
                      super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                      _M_impl.super__Vector_impl_data._M_start)->pg + lVar10);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)
             (*(long *)&(this_00->
                        super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar9].
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                        _M_impl + lVar10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    lVar10 = lVar10 + 0x10;
  }
  return (*(pointer *)
           ((long)&(this_00->
                   super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar9].
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
           + 8))[-1];
}

Assistant:

Expression GRUBuilder::set_h_impl(int prev, const vector<Expression>& h_new) {
  DYNET_ARG_CHECK(h_new.empty() || h_new.size() == layers,
                          "Number of inputs passed to RNNBuilder::set_h() (" << h_new.size() << ") "
                          "is not equal to the number of layers (" << layers << ")");
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));
  for (unsigned i = 0; i < layers; ++i) {
    Expression h_i = h_new[i];
    h[t][i] = h_i;
  }
  return h[t].back();
}